

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdAddVarDef(Dau_Dsd_t *p,char *pStr)

{
  int iVar1;
  size_t sVar2;
  int local_1c;
  int u;
  char *pStr_local;
  Dau_Dsd_t *p_local;
  
  sVar2 = strlen(pStr);
  if (7 < sVar2) {
    __assert_fail("strlen(pStr) < 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                  ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
  }
  if (p->nVarsUsed < 0x20) {
    for (local_1c = 0; local_1c < p->nVarsUsed; local_1c = local_1c + 1) {
      p->Cache[p->nVarsUsed][local_1c] = '\0';
    }
    for (local_1c = 0; local_1c < p->nVarsUsed; local_1c = local_1c + 1) {
      p->Cache[local_1c][p->nVarsUsed] = '\0';
    }
    iVar1 = p->nVarsUsed;
    p->nVarsUsed = iVar1 + 1;
    sprintf(p->pVarDefs[iVar1],"%s",pStr);
    return p->nVarsUsed + -1;
  }
  __assert_fail("p->nVarsUsed < 32",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
}

Assistant:

static inline int Dau_DsdAddVarDef( Dau_Dsd_t * p, char * pStr )
{
    int u;
    assert( strlen(pStr) < 8 );
    assert( p->nVarsUsed < 32 );
    for ( u = 0; u < p->nVarsUsed; u++ )
        p->Cache[p->nVarsUsed][u] = 0;
    for ( u = 0; u < p->nVarsUsed; u++ )
        p->Cache[u][p->nVarsUsed] = 0;
    sprintf( p->pVarDefs[p->nVarsUsed++], "%s", pStr );
    return p->nVarsUsed - 1;
}